

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteBuffer(CopyingOutputStreamAdaptor *this)

{
  CopyingOutputStream *pCVar1;
  uint uVar2;
  uchar *puVar3;
  CopyingOutputStreamAdaptor *this_local;
  
  if ((this->failed_ & 1U) == 0) {
    if (this->buffer_used_ == 0) {
      this_local._7_1_ = true;
    }
    else {
      pCVar1 = this->copying_stream_;
      puVar3 = internal::scoped_array<unsigned_char>::get(&this->buffer_);
      uVar2 = (*pCVar1->_vptr_CopyingOutputStream[2])(pCVar1,puVar3,(ulong)(uint)this->buffer_used_)
      ;
      if ((uVar2 & 1) == 0) {
        this->failed_ = true;
        FreeBuffer(this);
        this_local._7_1_ = false;
      }
      else {
        this->position_ = (long)this->buffer_used_ + this->position_;
        this->buffer_used_ = 0;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteBuffer() {
  if (failed_) {
    // Already failed on a previous write.
    return false;
  }

  if (buffer_used_ == 0) return true;

  if (copying_stream_->Write(buffer_.get(), buffer_used_)) {
    position_ += buffer_used_;
    buffer_used_ = 0;
    return true;
  } else {
    failed_ = true;
    FreeBuffer();
    return false;
  }
}